

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

int __thiscall
libtorrent::aux::part_file::do_hash<libtorrent::lcrypto::hasher256>
          (part_file *this,hasher256 *ph,ptrdiff_t len,piece_index_t piece,int offset,error_code *ec
          )

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  error_code *ec_00;
  span<const_char> data;
  span<char> buf;
  file_handle f;
  allocator_type local_61;
  vector<char,_std::allocator<char>_> buffer;
  unique_lock<std::mutex> l;
  piece_index_t piece_local;
  
  ec_00 = ec;
  piece_local = piece;
  ::std::unique_lock<std::mutex>::unique_lock(&l,&this->m_mutex);
  iVar3 = ::std::
          _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_piece_map)._M_h,&piece_local);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar1 = boost::system::detail::failed_impl
                      (2,&boost::system::detail::cat_holder<void>::generic_category_instance.
                          super_error_category);
    ec->val_ = 2;
    ec->failed_ = bVar1;
    ec->cat_ = &boost::system::detail::cat_holder<void>::generic_category_instance.
                super_error_category;
    iVar2 = -1;
  }
  else {
    iVar2 = *(int *)((long)iVar3.
                           super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                           ._M_cur + 0xc);
    open_file((part_file *)&f,(open_mode_t)(uint)this,(error_code *)0x20);
    if (ec->failed_ == false) {
      ::std::unique_lock<std::mutex>::unlock(&l);
      ::std::vector<char,_std::allocator<char>_>::vector(&buffer,len,&local_61);
      buf.m_ptr = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish +
                  -(long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      buf.m_len = (long)offset + (long)this->m_header_size + (long)this->m_piece_size * (long)iVar2;
      iVar2 = pread_all((aux *)(ulong)(uint)f.m_fd,
                        (handle_type)
                        buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,buf,(int64_t)ec,ec_00);
      data.m_len = (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      data.m_ptr = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      lcrypto::hasher256::update(ph,data);
      ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&buffer.super__Vector_base<char,_std::allocator<char>_>);
    }
    else {
      iVar2 = -1;
    }
    file_handle::~file_handle(&f);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&l);
  return iVar2;
}

Assistant:

int part_file::do_hash(Hasher& ph
		, std::ptrdiff_t const len
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(len >= 0);
		TORRENT_ASSERT(int(len) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = error_code(boost::system::errc::no_such_file_or_directory
				, boost::system::generic_category());
			return -1;
		}

		slot_index_t const slot = i->second;
		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		l.unlock();

		std::vector<char> buffer(static_cast<std::size_t>(len));
		std::int64_t const slot_offset = std::int64_t(m_header_size) + std::int64_t(static_cast<int>(slot)) * m_piece_size;
		int const ret = int(aux::pread_all(f.fd(), buffer, slot_offset + offset, ec));
		ph.update(buffer);
		return ret;
	}